

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

long coda_ascii_parse_uint64
               (char *buffer,long buffer_length,uint64_t *dst,int ignore_trailing_bytes)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  lVar5 = buffer_length;
  if (0 < buffer_length) {
    pcVar3 = buffer + buffer_length;
    do {
      if ((*buffer != ' ') && (*buffer != '\t')) goto LAB_001420e8;
      buffer = buffer + 1;
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
    lVar5 = 0;
    buffer = pcVar3;
  }
LAB_001420e8:
  cVar1 = *buffer;
  lVar5 = lVar5 - (ulong)(cVar1 == '+');
  if (lVar5 < 1) {
LAB_00142165:
    pcVar3 = "invalid format for ascii integer (no digits)";
LAB_00142175:
    coda_set_error(-0x67,pcVar3);
    return -1;
  }
  lVar6 = 0;
  uVar4 = 0;
  do {
    if ((byte)(buffer[lVar6 + (ulong)(cVar1 == '+')] - 0x3aU) < 0xf6) {
      if ((int)lVar6 == 0) goto LAB_00142165;
      if (ignore_trailing_bytes != 0) goto LAB_0014215d;
      lVar5 = lVar5 + 1;
      pcVar3 = buffer + lVar6 + (ulong)(cVar1 == '+');
      goto LAB_00142199;
    }
    uVar7 = (ulong)(byte)(buffer[lVar6 + (ulong)(cVar1 == '+')] - 0x30);
    if (~uVar7 / 10 < uVar4) {
      pcVar3 = "value too large for ascii integer";
      goto LAB_00142175;
    }
    uVar4 = uVar7 + uVar4 * 10;
    lVar6 = lVar6 + 1;
    bVar2 = 1 < lVar5;
    lVar5 = lVar5 + -1;
  } while (bVar2);
LAB_0014214f:
  lVar5 = 0;
LAB_0014215d:
  *dst = uVar4;
  return buffer_length - lVar5;
  while( true ) {
    pcVar3 = pcVar3 + 1;
    lVar5 = lVar5 + -1;
    if (lVar5 < 2) break;
LAB_00142199:
    if ((*pcVar3 != ' ') && (*pcVar3 != '\t')) {
      pcVar3 = "invalid format for ascii integer";
      goto LAB_00142175;
    }
  }
  goto LAB_0014214f;
}

Assistant:

long coda_ascii_parse_uint64(const char *buffer, long buffer_length, uint64_t *dst, int ignore_trailing_bytes)
{
    long length;
    int integer_length;
    uint64_t value;

    length = buffer_length;

    while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
    {
        buffer++;
        length--;
    }

    if (*buffer == '+')
    {
        buffer++;
        length--;
    }

    value = 0;
    integer_length = 0;
    while (length > 0)
    {
        int64_t digit;

        if (*buffer < '0' || *buffer > '9')
        {
            break;
        }
        digit = *buffer - '0';
        if (value > (MAXUINT64 - digit) / 10)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "value too large for ascii integer");
            return -1;
        }
        value = 10 * value + digit;
        integer_length++;
        buffer++;
        length--;
    }
    if (integer_length == 0)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer (no digits)");
        return -1;
    }
    if (!ignore_trailing_bytes && length != 0)
    {
        while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
        {
            buffer++;
            length--;
        }
        if (length != 0)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer");
            return -1;
        }
    }

    *dst = value;

    return buffer_length - length;
}